

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_9::DiskHandle::createNamedTemporary
          (String *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,WriteMode mode,
          Function<int_(kj::StringPtr)> *tryCreate)

{
  PathPtr finalName_00;
  DiskHandle *pDVar1;
  bool bVar2;
  int iVar3;
  WriteMode WVar4;
  size_t sVar5;
  String *pSVar6;
  Function<int_(kj::StringPtr)> *pFVar7;
  PathPtr PVar8;
  char (*in_stack_fffffffffffffe00) [9];
  Fault local_160;
  Fault f_1;
  Function<int_(kj::StringPtr)> local_118;
  String *local_108;
  String *pSStack_100;
  int local_ec;
  undefined1 auStack_e8 [4];
  int error;
  String *local_e0;
  int local_d4;
  undefined1 auStack_d0 [4];
  int _kjSyscallError;
  undefined1 local_b9;
  uint local_b8;
  undefined1 local_b1;
  undefined1 local_b0 [8];
  String path;
  undefined1 local_90 [40];
  undefined1 local_68 [8];
  String pathPrefix;
  Fault local_40;
  Fault f;
  Function<int_(kj::StringPtr)> *tryCreate_local;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr finalName_local;
  
  finalName_local.parts.ptr = (String *)finalName.parts.size_;
  this_local = (DiskHandle *)finalName.parts.ptr;
  pSVar6 = (String *)this;
  f.exception = (Exception *)tryCreate;
  finalName_local.parts.size_ = (size_t)__return_storage_ptr__;
  sVar5 = PathPtr::size((PathPtr *)&this_local);
  if (sVar5 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x388,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  if (((anonymous_namespace)::DiskHandle::
       createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0'
      ) && (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::DiskHandle::
                                         createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                                         ::pid), iVar3 != 0)) {
    createNamedTemporary::pid = getpid();
    __cxa_guard_release(&(anonymous_namespace)::DiskHandle::
                         createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                         ::pid);
  }
  String::String((String *)local_68);
  sVar5 = PathPtr::size((PathPtr *)&this_local);
  if (1 < sVar5) {
    local_90._0_16_ = (undefined1  [16])PathPtr::parent((PathPtr *)&this_local);
    path.content.disposer._7_1_ = 0x2f;
    str<kj::PathPtr,char>
              ((String *)(local_90 + 0x10),(kj *)local_90,
               (PathPtr *)((long)&path.content.disposer + 7),(char *)local_90._0_8_);
    pSVar6 = (String *)(local_90 + 0x10);
    String::operator=((String *)local_68,pSVar6);
    String::~String((String *)(local_90 + 0x10));
  }
  local_b1 = 0x2e;
  local_b8 = createNamedTemporary::counter;
  local_b9 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  _auStack_d0 = (String *)PathPtr::basename((PathPtr *)&this_local,(char *)pSVar6);
  pSVar6 = PathPtr::operator[]((PathPtr *)auStack_d0,0);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            ((String *)local_b0,(kj *)local_68,(String *)".kj-tmp.",
             (char (*) [9])&createNamedTemporary::pid,(int *)&local_b1,(char *)&local_b8,
             (uint *)&local_b9,(char *)pSVar6,(String *)".partial",in_stack_fffffffffffffe00);
  local_e0 = (String *)local_b0;
  _auStack_e8 = tryCreate;
  local_d4 = kj::_::Debug::
             syscallError<kj::(anonymous_namespace)::DiskHandle::createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)const::_lambda()_1_>
                       ((anon_class_16_2_a6651fa5 *)auStack_e8,false);
  if (local_d4 == 0) {
    pSVar6 = mv<kj::String>((String *)local_b0);
    String::String(__return_storage_ptr__,pSVar6);
LAB_008b2ea1:
    String::~String((String *)local_b0);
    String::~String((String *)local_68);
    return __return_storage_ptr__;
  }
  local_ec = local_d4;
  if (local_d4 == 2) {
    bVar2 = has<kj::WriteMode,void>(mode,CREATE_PARENT);
    if (bVar2) {
      sVar5 = PathPtr::size((PathPtr *)&this_local);
      if (1 < sVar5) {
        PVar8 = PathPtr::parent((PathPtr *)&this_local);
        WVar4 = operator|(CREATE,MODIFY);
        WVar4 = operator|(WVar4,CREATE_PARENT);
        bVar2 = tryMkdir(this,PVar8,WVar4,true);
        if (bVar2) {
          WVar4 = operator-(mode,CREATE_PARENT);
          pSVar6 = finalName_local.parts.ptr;
          pDVar1 = this_local;
          pFVar7 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
          Function<int_(kj::StringPtr)>::Function((Function<int_(kj::StringPtr)> *)&f_1,pFVar7);
          PVar8.parts.size_ = (size_t)pSVar6;
          PVar8.parts.ptr = (String *)pDVar1;
          createNamedTemporary
                    (__return_storage_ptr__,this,PVar8,WVar4,(Function<int_(kj::StringPtr)> *)&f_1);
          Function<int_(kj::StringPtr)>::~Function((Function<int_(kj::StringPtr)> *)&f_1);
          goto LAB_008b2ea1;
        }
      }
    }
  }
  else if (local_d4 == 0x11) {
    local_108 = (String *)this_local;
    pSStack_100 = finalName_local.parts.ptr;
    pFVar7 = mv<kj::Function<int(kj::StringPtr)>>(tryCreate);
    Function<int_(kj::StringPtr)>::Function(&local_118,pFVar7);
    finalName_00.parts.size_ = (size_t)pSStack_100;
    finalName_00.parts.ptr = local_108;
    createNamedTemporary(__return_storage_ptr__,this,finalName_00,mode,&local_118);
    Function<int_(kj::StringPtr)>::~Function(&local_118);
    goto LAB_008b2ea1;
  }
  kj::_::Debug::Fault::Fault<int,kj::String&>
            (&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x3a1,local_ec,"create(path)","path",(String *)local_b0);
  kj::_::Debug::Fault::fatal(&local_160);
}

Assistant:

String createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self");
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        KJ_FALLTHROUGH;
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path);
    }

    return kj::mv(path);
  }